

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O1

testing_base testing_new(int argc,char **argv,int flags)

{
  byte bVar1;
  char *pcVar2;
  FILE *__stream;
  int iVar3;
  testing_base ptVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  byte *__s1;
  byte *pbVar10;
  uint uVar11;
  bool bVar12;
  
  ptVar4 = (testing_base)malloc(0x78);
  ptVar4->flags = 0;
  ptVar4->parallelism = 0;
  ptVar4->fp = (FILE *)0x0;
  ptVar4->argn = 0;
  ptVar4->argc = 0;
  ptVar4->argv = (char **)0x0;
  ptVar4->prog = (char *)0x0;
  ptVar4->suppress_header = 0;
  ptVar4->run_tests = 0;
  ptVar4->run_benchmarks = 0;
  ptVar4->benchmarks_running = 0;
  ptVar4->include_pat = (char *)0x0;
  ptVar4->exclude_pat = (char *)0x0;
  ptVar4->longshort = 0;
  ptVar4->verbose = 0;
  *(undefined8 *)&ptVar4->testing_mu = 0;
  (ptVar4->testing_mu).waiters = (nsync_dll_element_s_ *)0x0;
  *(undefined8 *)&ptVar4->is_uniprocessor = 0;
  ptVar4->children = (nsync_dll_list_)0x0;
  ptVar4->child_count = 0;
  ptVar4->exit_status = 0;
  ptVar4->flags = flags;
  __stream = _stderr;
  ptVar4->fp = (FILE *)_stderr;
  ptVar4->argc = argc;
  ptVar4->argv = argv;
  ptVar4->parallelism = 1;
  ptVar4->run_tests = 1;
  ptVar4->is_uniprocessor = -1;
  pcVar2 = *argv;
  ptVar4->prog = pcVar2;
  lVar9 = 0;
  pcVar8 = pcVar2;
  do {
    pcVar5 = strrchr(pcVar8,(int)"/\\"[lVar9]);
    pcVar7 = pcVar5 + 1;
    if (pcVar5 == (char *)0x0) {
      pcVar7 = pcVar8;
    }
    lVar9 = lVar9 + 1;
    pcVar8 = pcVar7;
  } while (lVar9 != 2);
  ptVar4->prog = pcVar7;
  uVar6 = 0;
  uVar11 = 1;
  bVar12 = argc == 1;
  if (!bVar12) {
    __s1 = (byte *)argv[1];
    if (*__s1 == 0x2d) {
LAB_00104bd7:
      iVar3 = strcmp((char *)__s1,"--");
      pbVar10 = __s1;
      if (iVar3 != 0) {
LAB_00104c04:
        do {
          pbVar10 = pbVar10 + 1;
          bVar1 = *pbVar10;
          if (0x61 < bVar1) {
            switch(bVar1) {
            case 0x68:
              ptVar4->suppress_header = 1;
              goto LAB_00104c04;
            case 0x69:
            case 0x6a:
            case 0x6b:
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x72:
            case 0x74:
            case 0x75:
            case 0x77:
              goto switchD_00104c1d_caseD_69;
            case 0x6c:
              ptVar4->longshort = ptVar4->longshort + 1;
              goto LAB_00104c04;
            case 0x6d:
              uVar11 = uVar11 + 1;
              if (uVar11 != argc) {
                ptVar4->include_pat = argv[(int)uVar11];
                goto LAB_00104c04;
              }
              pcVar8 = "%s: -m flag expects ,- or |-separated strings\n";
              break;
            case 0x6e:
              uVar11 = uVar11 + 1;
              if ((uVar11 != argc) && (iVar3 = atoi(argv[(int)uVar11]), 0 < iVar3)) {
                ptVar4->parallelism = iVar3;
                goto LAB_00104c04;
              }
              pcVar8 = "%s: -n flag expects parallelism value >= 1\n";
              break;
            case 0x73:
              ptVar4->longshort = ptVar4->longshort + -1;
              goto LAB_00104c04;
            case 0x76:
              ptVar4->verbose = 1;
              goto LAB_00104c04;
            case 0x78:
              uVar11 = uVar11 + 1;
              if (uVar11 != argc) {
                ptVar4->exclude_pat = argv[(int)uVar11];
                goto LAB_00104c04;
              }
              pcVar8 = "%s: -x flag expects ,- or |-separated strings\n";
              break;
            default:
              if (bVar1 != 0x62) goto switchD_00104c1d_caseD_69;
              ptVar4->run_benchmarks = 1;
              goto LAB_00104c04;
            }
            fprintf(__stream,pcVar8,pcVar2);
            goto LAB_00104da0;
          }
          if (bVar1 != 0x42) goto LAB_00104cc9;
          ptVar4->run_tests = 0;
          ptVar4->run_benchmarks = 1;
        } while( true );
      }
    }
LAB_00104cf0:
    uVar6 = 0;
    if (!bVar12) {
      iVar3 = strcmp(argv[(int)uVar11],"--");
      uVar6 = (uint)(iVar3 == 0);
    }
  }
LAB_00104d18:
  ptVar4->argn = uVar11 + uVar6;
  return ptVar4;
LAB_00104cc9:
  if (bVar1 != 0) {
    if (bVar1 == 0x48) {
      output_header(_stdout,"");
      exit(0);
    }
switchD_00104c1d_caseD_69:
    fprintf(__stream,"%s: unrecognized flag \'%c\' in arg %d: \"%s\"\n",pcVar2,
            (ulong)(uint)(int)(char)bVar1,(ulong)uVar11,__s1);
LAB_00104da0:
    exit(2);
  }
  uVar11 = uVar11 + 1;
  bVar12 = uVar11 == argc;
  if (bVar12) {
    uVar6 = 0;
    goto LAB_00104d18;
  }
  __s1 = (byte *)argv[(int)uVar11];
  if (*__s1 != 0x2d) goto LAB_00104cf0;
  goto LAB_00104bd7;
}

Assistant:

testing_base testing_new (int argc, char *argv[], int flags) {
	static const char sep[] = { '/', '\\' };
	int i;
	int argn;
	testing_base tb = (testing_base)malloc (sizeof (*tb));
	memset ((void *) tb, 0, sizeof (*tb));
	tb->flags = flags;
	tb->fp = stderr;
	tb->argc = argc;
	tb->argv = argv;
	tb->parallelism = 1;
	tb->run_tests = 1;
	tb->is_uniprocessor = -1;
	tb->prog = tb->argv[0];
	for (i = 0; i != sizeof (sep) / sizeof (sep[0]); i++) {
		char *last = strrchr (tb->prog, sep[i]);
		if (last != NULL) {
			tb->prog = last + 1;
		}
	}
	for (argn = 1; argn != argc && argv[argn][0] == '-' &&
		       strcmp (argv[argn], "--") != 0; argn++) {
		const char *arg = argv[argn];
		const char *f;
		for (f = &arg[1]; *f != 0; f++) {
			process_flag (tb, &argn, argc, argv, *f, arg);
		}
	}
	tb->argn = argn + (argn != argc && strcmp (argv[argn], "--") == 0);
	return (tb);
}